

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_damped_harmonic_symplectic.c
# Opt level: O0

int qdot(sunrealtype t,N_Vector yvec,N_Vector ydotvec,void *user_data)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype sVar4;
  double dVar5;
  sunrealtype p;
  sunrealtype *ydot;
  sunrealtype *y;
  
  pdVar2 = (double *)N_VGetArrayPointer(in_RDI);
  lVar3 = N_VGetArrayPointer(in_RSI);
  dVar1 = *pdVar2;
  sVar4 = F(5.21684409509418e-318);
  dVar5 = exp(-sVar4);
  *(double *)(lVar3 + 8) = dVar1 * dVar5;
  return 0;
}

Assistant:

int qdot(sunrealtype t, N_Vector yvec, N_Vector ydotvec, void* user_data)
{
  sunrealtype* y      = N_VGetArrayPointer(yvec);
  sunrealtype* ydot   = N_VGetArrayPointer(ydotvec);
  const sunrealtype p = y[0];

  ydot[1] = p * exp(-F(t));

  return 0;
}